

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

void Hacl_Impl_BignumQ_Mul_barrett_reduction_(uint64_t *z,uint64_t *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  FStar_UInt128_t qmu [9];
  uint64_t local_1e0 [5];
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  uint64_t local_190;
  uint64_t local_188;
  uint64_t local_180;
  uint64_t local_178;
  ulong local_170;
  uint64_t local_168 [4];
  ulong local_148;
  undefined1 auStack_140 [16];
  ulong local_130;
  ulong uStack_128;
  ulong local_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  uint64_t local_f0;
  long lStack_e8;
  long local_e0;
  long lStack_d8;
  long local_d0;
  undefined1 local_c8 [8];
  undefined8 auStack_c0 [18];
  
  memset(&local_198,0,0xd0);
  local_1e0[0] = 0x9ce5a30a2c131b;
  local_1e0[1] = 0x215d086329a7ed;
  local_1e0[2] = 0xffffffffeb2106;
  local_1e0[3] = 0xffffffffffffff;
  local_1e0[4] = 0xfffffffff;
  for (lVar16 = 0; lVar16 != 0x90; lVar16 = lVar16 + 0x10) {
    *(undefined8 *)((long)auStack_c0 + lVar16 + -8) = 0;
    *(undefined8 *)((long)auStack_c0 + lVar16) = 0;
  }
  uVar17 = t[4];
  local_1b8 = uVar17 >> 0x18 | (t[5] & 0xffffff) << 0x20;
  uStack_1b0 = t[5] >> 0x18 | (t[6] & 0xffffff) << 0x20;
  local_198 = t[8] >> 0x18 | (ulong)((uint)t[9] & 0xffffff) << 0x20;
  local_1a8 = t[6] >> 0x18 | (t[7] & 0xffffff) << 0x20;
  uStack_1a0 = t[7] >> 0x18 | (t[8] & 0xffffff) << 0x20;
  Hacl_Impl_BignumQ_Mul_mul_5((FStar_UInt128_t *)local_c8,&local_1b8,local_1e0);
  Hacl_Impl_BignumQ_Mul_carry(local_168,(FStar_UInt128_t *)local_c8);
  auVar11._4_8_ = auStack_140._8_8_;
  auVar11._0_4_ = auStack_140._12_4_;
  auVar18._0_8_ = auVar11._0_8_ << 0x20;
  auVar18._8_4_ = (int)local_130;
  auVar18._12_4_ = (int)(local_130 >> 0x20);
  local_108 = auVar18._0_8_ >> 0x28 | (local_130 & 0xffffffffff) << 0x10;
  uStack_100 = auVar18._8_8_ >> 0x28 | (uStack_128 & 0xffffffffff) << 0x10;
  local_118 = local_148 >> 0x28 | (auStack_140._0_8_ & 0xffffffffff) << 0x10;
  uStack_110 = auStack_140._0_8_ >> 0x28 | (auStack_140._8_8_ & 0xffffffffff) << 0x10;
  local_f8 = uStack_128 >> 0x28 | (local_120 & 0xffffffffff) << 0x10;
  local_190 = *t;
  local_188 = t[1];
  local_180 = t[2];
  local_178 = t[3];
  local_170 = uVar17 & 0xffffffffff;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_118;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_118;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_118;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uStack_110;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_118;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uStack_110;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_110;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_108;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uStack_100;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_108;
  local_1b8 = SUB168(ZEXT816(0x12631a5cf5d3ed) * auVar4,0) & 0xffffffffffffff;
  auVar4 = (ZEXT816(0x12631a5cf5d3ed) * auVar4 >> 0x38) +
           ZEXT816(0x12631a5cf5d3ed) * auVar5 + ZEXT816(0xf9dea2f79cd658) * auVar6;
  uStack_1b0 = auVar4._0_8_;
  uVar17 = auVar4._8_8_;
  auVar12._8_8_ = uVar17 >> 0x38;
  auVar12._0_8_ = uVar17 * 0x100 | uStack_1b0 >> 0x38;
  uStack_1b0 = uStack_1b0 & 0xffffffffffffff;
  auVar12 = ZEXT816(0xf9dea2f79cd658) * auVar7 + ZEXT816(0x12631a5cf5d3ed) * auVar8 +
            auVar1 * ZEXT816(0x14de) + auVar12;
  local_1a8 = auVar12._0_8_;
  uVar17 = auVar12._8_8_;
  auVar13._8_8_ = uVar17 >> 0x38;
  auVar13._0_8_ = uVar17 * 0x100 | local_1a8 >> 0x38;
  local_1a8 = local_1a8 & 0xffffffffffffff;
  auVar13 = ZEXT816(0xf9dea2f79cd658) * auVar10 + ZEXT816(0x12631a5cf5d3ed) * auVar9 +
            auVar3 * ZEXT816(0x14de) + auVar2 * ZEXT816(0) + auVar13;
  uVar17 = auVar13._0_8_;
  uStack_1a0 = uVar17 & 0xffffffffffffff;
  local_198 = local_f8 * 0x12631a5cf5d3ed + local_108 * 0x14de + uStack_100 * 0xf9dea2f79cd658 +
              local_118 * 0x10000000 + (auVar13._8_8_ * 0x100 | uVar17 >> 0x38) & 0xffffffffff;
  uVar17 = local_190 - local_1b8;
  uVar14 = (((long)uVar17 >> 0x3f) + local_188) - uStack_1b0;
  uVar15 = ((long)uVar14 >> 0x3f) + (local_180 - local_1a8);
  local_f0 = (uVar17 >> 7 & 0x100000000000000) + uVar17;
  lStack_e8 = (uVar14 >> 7 & 0x100000000000000) + uVar14;
  uVar17 = ((long)uVar15 >> 0x3f) + (local_178 - uStack_1a0);
  uVar14 = ((long)uVar17 >> 0x3f) + (local_170 - local_198);
  local_d0 = (uVar14 >> 0x17 & 0x10000000000) + uVar14;
  local_e0 = (uVar15 >> 7 & 0x100000000000000) + uVar15;
  lStack_d8 = (uVar17 >> 7 & 0x100000000000000) + uVar17;
  Hacl_Impl_BignumQ_Mul_subm_conditional(z,&local_f0);
  return;
}

Assistant:

static void Hacl_Impl_BignumQ_Mul_barrett_reduction_(uint64_t *z, uint64_t *t)
{
  uint64_t tmp[40U] = { 0U };
  uint64_t *m1 = tmp;
  uint64_t *mu1 = tmp + (uint32_t)5U;
  uint64_t *tmp1 = tmp + (uint32_t)10U;
  Hacl_Impl_BignumQ_Mul_make_m(m1);
  Hacl_Impl_BignumQ_Mul_make_mu(mu1);
  Hacl_Impl_BignumQ_Mul_barrett_reduction__(z, t, m1, mu1, tmp1);
}